

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O0

void __thiscall
MeCab::Allocator<mecab_node_t,_mecab_path_t>::Allocator(Allocator<mecab_node_t,_mecab_path_t> *this)

{
  FreeList<mecab_node_t> *p;
  result_pair_type *p_00;
  undefined8 *in_RDI;
  size_t in_stack_ffffffffffffff98;
  FreeList<mecab_node_t> *in_stack_ffffffffffffffa0;
  
  *in_RDI = &PTR__Allocator_001898a8;
  in_RDI[1] = 0;
  p = (FreeList<mecab_node_t> *)operator_new(0x38);
  FreeList<mecab_node_t>::FreeList(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  scoped_ptr<MeCab::FreeList<mecab_node_t>_>::scoped_ptr
            ((scoped_ptr<MeCab::FreeList<mecab_node_t>_> *)(in_RDI + 2),p);
  scoped_ptr<MeCab::FreeList<mecab_path_t>_>::scoped_ptr
            ((scoped_ptr<MeCab::FreeList<mecab_path_t>_> *)(in_RDI + 4),
             (FreeList<mecab_path_t> *)0x0);
  scoped_ptr<MeCab::ChunkFreeList<char>_>::scoped_ptr
            ((scoped_ptr<MeCab::ChunkFreeList<char>_> *)(in_RDI + 6),(ChunkFreeList<char> *)0x0);
  scoped_ptr<MeCab::NBestGenerator>::scoped_ptr
            ((scoped_ptr<MeCab::NBestGenerator> *)(in_RDI + 8),(NBestGenerator *)0x0);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x14b840);
  p_00 = (result_pair_type *)operator_new__(0x2000);
  scoped_array<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::result_pair_type>
  ::scoped_array((scoped_array<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::result_pair_type>
                  *)(in_RDI + 0xd),p_00);
  return;
}

Assistant:

Allocator()
      : id_(0),
        node_freelist_(new FreeList<N>(NODE_FREELIST_SIZE)),
        path_freelist_(0),
        char_freelist_(0),
        nbest_generator_(0),
        results_(new Dictionary::result_type[kResultsSize]) {}